

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,"-K workspace sub folder\n");
  fprintf(_stderr,"-o Open Results Data (ORD) output\n");
  fprintf(_stderr,"-p [filename] ORD output in parquet format\n");
  fprintf(_stderr,"-c [filename] Average Loss Convergence Table (ALCT)\n");
  fprintf(_stderr,"-l [value] 0 <= confidence level <= 1, default 0.95\n");
  fprintf(_stderr,"-s skip header\n");
  fprintf(_stderr,"-v version\n");
  fprintf(_stderr,"-h help\n");
  return;
}

Assistant:

void help()
{
	fprintf(stderr, "-K workspace sub folder\n");
	fprintf(stderr, "-o Open Results Data (ORD) output\n");
	fprintf(stderr, "-p [filename] ORD output in parquet format\n");
	fprintf(stderr, "-c [filename] Average Loss Convergence Table (ALCT)\n");
	fprintf(stderr, "-l [value] 0 <= confidence level <= 1, default 0.95\n");
	fprintf(stderr, "-s skip header\n");
	fprintf(stderr, "-v version\n");
	fprintf(stderr, "-h help\n");
	
}